

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

Vec3ff embree::AnisotropicBlinn__sample(AnisotropicBlinn *This,float sx,float sy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  long in_RSI;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  float fVar4;
  float in_XMM1_Da;
  float fVar5;
  Vec3ff VVar6;
  Vec3fa wh;
  Vec3fa h;
  float pdf;
  float sinTheta;
  float cosTheta;
  float n;
  float cosPhi;
  float sinPhi;
  float norm;
  float cosPhi0;
  float sinPhi0;
  float phi;
  __m128 r_1;
  __m128 a_1;
  __m128 c;
  __m128 r;
  __m128 a;
  vint4 mask;
  float local_85c;
  undefined8 local_7f8;
  ulong uStack_7f0;
  float local_7d0;
  float local_7cc;
  float local_7c8;
  float local_7c4;
  float local_7c0;
  float local_7bc;
  float local_7b8;
  float local_7b4;
  float local_7b0;
  long local_7a8;
  undefined1 local_798 [16];
  ulong local_788;
  undefined8 uStack_780;
  float local_770;
  ulong local_758;
  undefined8 uStack_750;
  undefined1 local_748 [16];
  ulong local_738;
  undefined8 uStack_730;
  float local_71c;
  float local_718;
  float local_714;
  float local_710;
  float local_70c;
  undefined1 local_5d8 [16];
  undefined4 local_5bc;
  undefined1 local_5b8 [16];
  undefined4 local_59c;
  undefined1 local_598 [16];
  float local_57c;
  undefined1 local_578 [16];
  undefined4 local_55c;
  undefined1 local_558 [16];
  float local_53c;
  ulong local_538;
  undefined8 uStack_530;
  ulong local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  ulong local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  ulong local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  ulong local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  ulong local_478;
  undefined8 uStack_470;
  ulong local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  ulong local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  ulong local_418;
  undefined8 uStack_410;
  undefined1 *local_370;
  float *local_368;
  float *local_360;
  float local_354;
  undefined4 local_350;
  float local_34c;
  undefined1 *local_348;
  undefined1 *local_340;
  ulong local_278;
  undefined8 uStack_270;
  ulong local_268;
  undefined8 uStack_260;
  ulong local_258;
  undefined8 uStack_250;
  
  local_370 = &two_pi;
  local_7b4 = in_XMM0_Da * 6.2831855;
  local_7b0 = in_XMM1_Da;
  local_7a8 = in_RSI;
  fVar4 = sqrtf(*(float *)(in_RSI + 0x50) + 1.0);
  local_7b8 = sinf(local_7b4);
  local_7b8 = fVar4 * local_7b8;
  fVar4 = sqrtf(*(float *)(local_7a8 + 0x54) + 1.0);
  local_7bc = cosf(local_7b4);
  local_7bc = fVar4 * local_7bc;
  local_70c = local_7b8;
  local_71c = local_7b8 * local_7b8 + local_7bc * local_7bc;
  local_598._4_4_ = 0;
  local_598._0_4_ = local_71c;
  local_738 = local_598._0_8_;
  uStack_730 = 0;
  local_278 = local_598._0_8_;
  uStack_270 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_598._0_8_;
  local_748 = rsqrtss(auVar2,auVar2);
  local_59c = 0x3fc00000;
  local_5b8 = ZEXT416(0x3fc00000);
  local_488 = local_748._0_8_;
  uVar3 = local_488;
  uStack_480 = local_748._8_8_;
  local_488._0_4_ = local_748._0_4_;
  local_478 = (ulong)(uint)((float)local_488 * 1.5);
  uStack_470 = 0;
  local_5bc = 0xbf000000;
  local_5d8 = ZEXT416(0xbf000000);
  local_4a8 = local_5d8._0_8_;
  uStack_4a0 = 0;
  local_498 = (ulong)(uint)(local_71c * -0.5);
  uStack_490 = 0;
  local_4c8 = local_748._0_8_;
  uStack_4c0 = local_748._8_8_;
  local_7c0 = local_71c * -0.5 * (float)local_488;
  local_4b8 = (ulong)(uint)local_7c0;
  uStack_4b0 = 0;
  local_4e8 = local_748._0_8_;
  uStack_4e0 = local_748._8_8_;
  local_4d8 = CONCAT44(local_748._4_4_,(float)local_488 * (float)local_488);
  uStack_4d0 = local_748._8_8_;
  local_508 = local_4d8;
  uStack_500 = local_748._8_8_;
  local_7c0 = local_7c0 * (float)local_488 * (float)local_488;
  local_4f8 = (ulong)(uint)local_7c0;
  uStack_4f0 = 0;
  local_268 = local_4f8;
  uStack_260 = 0;
  local_7c0 = (float)local_488 * 1.5 + local_7c0;
  local_258 = (ulong)(uint)local_7c0;
  uStack_250 = 0;
  local_758 = local_258;
  uStack_750 = 0;
  local_528 = local_258;
  uStack_520 = 0;
  local_7c4 = local_7b8 * local_7c0;
  local_7c8 = local_7bc * local_7c0;
  local_7cc = *(float *)(local_7a8 + 0x50) * local_7c8 * local_7c8 +
              *(float *)(local_7a8 + 0x54) * local_7c4 * local_7c4;
  local_770 = local_7cc + 1.0;
  local_558._4_4_ = 0;
  local_558._0_4_ = local_770;
  local_788 = local_558._0_8_;
  uStack_780 = 0;
  local_538 = local_558._0_8_;
  uStack_530 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_558._0_8_;
  local_798 = rcpss(auVar1,auVar1);
  local_55c = 0x40000000;
  local_578 = ZEXT416(0x40000000);
  local_448 = local_558._0_8_;
  uStack_440 = 0;
  local_438._0_4_ = local_798._0_4_;
  fVar4 = (float)local_438;
  local_438._4_4_ = local_798._4_4_;
  local_438._0_4_ = (float)local_438 * local_770;
  uStack_430 = local_798._8_8_;
  local_428 = local_438;
  uStack_420 = local_798._8_8_;
  fVar5 = 2.0 - (float)local_438;
  local_418 = (ulong)(uint)fVar5;
  uStack_410 = 0;
  local_468 = local_418;
  uStack_460 = 0;
  fVar4 = fVar4 * fVar5;
  local_458 = CONCAT44(local_438._4_4_,fVar4);
  uStack_450 = local_798._8_8_;
  local_518 = local_458;
  uStack_510 = local_798._8_8_;
  local_718 = local_7c4;
  local_714 = local_7c8;
  local_710 = local_7bc;
  local_598 = ZEXT416((uint)local_71c);
  local_57c = local_71c;
  local_558 = ZEXT416((uint)local_770);
  local_53c = local_770;
  local_488 = uVar3;
  local_7d0 = powf(local_7b0,fVar4);
  local_368 = &local_7d0;
  local_348 = &zero;
  local_340 = &one;
  local_354 = -local_7d0 * local_7d0 + 1.0;
  local_350 = 0;
  local_85c = local_354;
  if (local_354 <= 0.0) {
    local_85c = 0.0;
  }
  local_34c = local_85c;
  local_360 = local_368;
  sqrtf(local_85c);
  fVar4 = *(float *)(local_7a8 + 0x58);
  fVar5 = powf(local_7d0,local_7cc);
  *in_RDI = local_7f8;
  in_RDI[1] = uStack_7f0 & 0xffffffff | (ulong)(uint)(fVar4 * fVar5) << 0x20;
  VVar6.field_0._8_8_ = in_RDI;
  VVar6.field_0._0_8_ = local_7f8;
  return (Vec3ff)VVar6.field_0;
}

Assistant:

inline Vec3ff AnisotropicBlinn__sample(const AnisotropicBlinn* This, const float sx, const float sy)
{
  const float phi =float(two_pi)*sx;
  const float sinPhi0 = sqrtf(This->nx+1)*sinf(phi);
  const float cosPhi0 = sqrtf(This->ny+1)*cosf(phi);
  const float norm = rsqrt(sqr(sinPhi0)+sqr(cosPhi0));
  const float sinPhi = sinPhi0*norm;
  const float cosPhi = cosPhi0*norm;
  const float n = This->nx*sqr(cosPhi)+This->ny*sqr(sinPhi);
  const float cosTheta = powf(sy,rcp(n+1));
  const float sinTheta = cos2sin(cosTheta);
  const float pdf = This->norm1*powf(cosTheta,n);
  const Vec3fa h = Vec3fa(cosPhi * sinTheta, sinPhi * sinTheta, cosTheta);
  const Vec3fa wh = h.x*This->dx + h.y*This->dy + h.z*This->dz;
  return Vec3ff(wh,pdf);
}